

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::PostsolveBasis
          (Model *this,vector<int,_std::allocator<int>_> *basic_status_solver,Int *cbasis_user,
          Int *vbasis_user)

{
  vector<int,_std::allocator<int>_> vbasis_temp;
  vector<int,_std::allocator<int>_> cbasis_temp;
  allocator_type local_59;
  _Vector_base<int,_std::allocator<int>_> local_58;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,(long)this->num_constr_,
             (allocator_type *)&local_58);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,(long)this->num_var_,&local_59);
  DualizeBackBasis(this,basic_status_solver,(vector<int,_std::allocator<int>_> *)&local_40,
                   (vector<int,_std::allocator<int>_> *)&local_58);
  ScaleBackBasis(this,basic_status_solver,(vector<int,_std::allocator<int>_> *)&local_58);
  if (cbasis_user != (Int *)0x0) {
    if ((long)local_40._M_impl.super__Vector_impl_data._M_finish -
        (long)local_40._M_impl.super__Vector_impl_data._M_start != 0) {
      memmove(cbasis_user,local_40._M_impl.super__Vector_impl_data._M_start,
              (long)local_40._M_impl.super__Vector_impl_data._M_finish -
              (long)local_40._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (vbasis_user != (Int *)0x0) {
    if ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58._M_impl.super__Vector_impl_data._M_start != 0) {
      memmove(vbasis_user,local_58._M_impl.super__Vector_impl_data._M_start,
              (long)local_58._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void Model::PostsolveBasis(const std::vector<Int>& basic_status_solver,
                           Int* cbasis_user, Int* vbasis_user) const {
    const Int m = rows();
    const Int n = cols();
    assert((Int)basic_status_solver.size() == n+m);

    std::vector<Int> cbasis_temp(num_constr_);
    std::vector<Int> vbasis_temp(num_var_);
    DualizeBackBasis(basic_status_solver, cbasis_temp, vbasis_temp);
    ScaleBackBasis(cbasis_temp, vbasis_temp);
    if (cbasis_user)
        std::copy(std::begin(cbasis_temp), std::end(cbasis_temp), cbasis_user);
    if (vbasis_user)
        std::copy(std::begin(vbasis_temp), std::end(vbasis_temp), vbasis_user);
}